

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogNormalizePublic(xmlChar *pubID)

{
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  ulong uVar6;
  bool bVar7;
  
  if (pubID == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  bVar7 = true;
  bVar2 = true;
  for (pbVar4 = pubID; (bVar7 && (bVar5 = *pbVar4, bVar5 != 0)); pbVar4 = pbVar4 + 1) {
    bVar1 = false;
    if (bVar5 < 0x21) {
      bVar7 = true;
      if (((0x100002600U >> ((ulong)(uint)bVar5 & 0x3f) & 1) != 0) &&
         (bVar7 = bVar5 == 0x20 && !bVar2, bVar1 = bVar2, bVar5 == 0x20 && !bVar2)) {
        bVar1 = true;
      }
    }
    else {
      bVar7 = true;
    }
    bVar2 = bVar1;
  }
  bVar1 = false;
  if (!bVar2 && bVar7) {
    return (xmlChar *)0x0;
  }
  pbVar3 = xmlStrdup(pubID);
  pbVar4 = pbVar3;
  do {
    bVar5 = *pubID;
    uVar6 = (ulong)bVar5;
    if (uVar6 < 0x21) {
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0) {
          *pbVar4 = 0;
          return pbVar3;
        }
        goto LAB_0013c0f5;
      }
      if (pbVar4 != pbVar3) {
        bVar1 = true;
      }
    }
    else {
LAB_0013c0f5:
      if (bVar1) {
        *pbVar4 = 0x20;
        pbVar4 = pbVar4 + 1;
        bVar5 = *pubID;
      }
      *pbVar4 = bVar5;
      pbVar4 = pbVar4 + 1;
      bVar1 = false;
    }
    pubID = pubID + 1;
  } while( true );
}

Assistant:

static xmlChar *
xmlCatalogNormalizePublic(const xmlChar *pubID)
{
    int ok = 1;
    int white;
    const xmlChar *p;
    xmlChar *ret;
    xmlChar *q;

    if (pubID == NULL)
        return(NULL);

    white = 1;
    for (p = pubID;*p != 0 && ok;p++) {
        if (!xmlIsBlank_ch(*p))
            white = 0;
        else if (*p == 0x20 && !white)
            white = 1;
        else
            ok = 0;
    }
    if (ok && !white)	/* is normalized */
        return(NULL);

    ret = xmlStrdup(pubID);
    q = ret;
    white = 0;
    for (p = pubID;*p != 0;p++) {
        if (xmlIsBlank_ch(*p)) {
            if (q != ret)
                white = 1;
        } else {
            if (white) {
                *(q++) = 0x20;
                white = 0;
            }
            *(q++) = *p;
        }
    }
    *q = 0;
    return(ret);
}